

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O3

void iutest::detail::iuUniversalPrinter<int[2][2]>::Print(int (*a) [2] [2],iu_ostream *os)

{
  std::__ostream_insert<char,std::char_traits<char>>(os,"{ ",2);
  iuUniversalPrinter<int[2]>::Print(*a,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  iuUniversalPrinter<int[2]>::Print(*a + 1,os);
  std::__ostream_insert<char,std::char_traits<char>>(os," }",2);
  return;
}

Assistant:

static void Print(const T(&a)[SIZE], iu_ostream* os)
    {
        UniversalPrintArray(a, SIZE, os);
    }